

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

uint32_t __thiscall r_comp::Compiler::add_hlp_reference(Compiler *this,string *reference_name)

{
  pointer pbVar1;
  __type _Var2;
  uint32_t i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    pbVar1 = (this->hlp_references).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->hlp_references).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->hlp_references,reference_name);
      return (int)((ulong)((long)(this->hlp_references).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->hlp_references).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
    }
    _Var2 = std::operator==(reference_name,pbVar1 + uVar3);
    if (_Var2) break;
    uVar3 = (ulong)((uint32_t)uVar3 + 1);
  }
  return (uint32_t)uVar3;
}

Assistant:

uint32_t Compiler::add_hlp_reference(std::string reference_name)
{
    for (uint32_t i = 0; i < hlp_references.size(); ++i)
        if (reference_name == hlp_references[i]) {
            return i;
        }

    hlp_references.push_back(reference_name);
    return hlp_references.size() - 1;
}